

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobIOSystem.h
# Opt level: O3

IOStream * __thiscall Assimp::BlobIOSystem::Open(BlobIOSystem *this,char *pFile,char *pMode)

{
  IOStream *pIVar1;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (*pMode == 'w') {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pFile,&local_41);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->created,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    pIVar1 = (IOStream *)Intern::AllocateFromAssimpHeap::operator_new(0x58);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pFile,&local_41);
    pIVar1->_vptr_IOStream = (_func_int **)&PTR__BlobIOStream_0080bbd0;
    pIVar1[1]._vptr_IOStream = (_func_int **)0x0;
    pIVar1[2]._vptr_IOStream = (_func_int **)0x0;
    pIVar1[3]._vptr_IOStream = (_func_int **)0x0;
    pIVar1[4]._vptr_IOStream = (_func_int **)0x0;
    pIVar1[5]._vptr_IOStream = (_func_int **)0x1000;
    pIVar1[6]._vptr_IOStream = (_func_int **)(pIVar1 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pIVar1 + 6),local_40._M_dataplus._M_p,
               local_40._M_dataplus._M_p + local_40._M_string_length);
    pIVar1[10]._vptr_IOStream = (_func_int **)this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pIVar1 = (IOStream *)0x0;
  }
  return pIVar1;
}

Assistant:

virtual IOStream* Open(const char* pFile,
        const char* pMode)
    {
        if (pMode[0] != 'w') {
            return NULL;
        }

        created.insert(std::string(pFile));
        return new BlobIOStream(this,std::string(pFile));
    }